

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

void __thiscall MeshLib::Solid::destroyVertex(Solid *this,Vertex *vertex)

{
  uint __line;
  char *__assertion;
  
  if (vertex->m_halfedge == (HalfEdge *)0x0) {
    if (vertex->m_trait == (Trait *)0x0) {
      AVL::Tree<MeshLib::Vertex>::remove(&this->m_verts,(char *)vertex);
      std::__cxx11::string::~string((string *)&vertex->m_string);
      operator_delete(vertex);
      return;
    }
    __assertion = "vertex->trait () == NULL";
    __line = 0x57;
  }
  else {
    __assertion = "vertex->halfedge () == NULL";
    __line = 0x56;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                ,__line,"void MeshLib::Solid::destroyVertex(Vertex *)");
}

Assistant:

void Solid::destroyVertex(Vertex * vertex)
{
    assert(vertex->halfedge () == NULL);
	assert(vertex->trait () == NULL);

	m_verts.remove (vertex);
    delete vertex;
}